

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O2

bool __thiscall
cmWhileCommand::InvokeInitialPass
          (cmWhileCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *param_2)

{
  pointer pcVar1;
  pointer pcVar2;
  cmWhileFunctionBlocker *this_00;
  allocator<char> local_49;
  string local_48;
  
  pcVar1 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pcVar1 == pcVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    this_00 = (cmWhileFunctionBlocker *)operator_new(0x90);
    cmWhileFunctionBlocker::cmWhileFunctionBlocker(this_00,(this->super_cmCommand).Makefile);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator=
              (&this_00->Args,args);
    cmMakefile::AddFunctionBlocker((this->super_cmCommand).Makefile,(cmFunctionBlocker *)this_00);
  }
  return pcVar1 != pcVar2;
}

Assistant:

bool cmWhileCommand::InvokeInitialPass(
  const std::vector<cmListFileArgument>& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // create a function blocker
  cmWhileFunctionBlocker* f = new cmWhileFunctionBlocker(this->Makefile);
  f->Args = args;
  this->Makefile->AddFunctionBlocker(f);

  return true;
}